

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode Curl_multi_pollset_ev
                    (Curl_multi *multi,Curl_easy *data,easy_pollset *ps,easy_pollset *last_ps)

{
  curl_socket_t *pcVar1;
  byte bVar2;
  bool bVar3;
  Curl_hash *sh;
  Curl_multi *pCVar4;
  int iVar5;
  int iVar6;
  Curl_sh_entry *pCVar7;
  void *pvVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  Curl_easy *data_local;
  Curl_hash *local_50;
  Curl_multi *local_48;
  ulong local_40;
  int local_34;
  
  local_50 = &multi->sockhash;
  uVar10 = 0;
  data_local = data;
  local_48 = multi;
  do {
    pCVar4 = local_48;
    sh = local_50;
    if (ps->num <= uVar10) {
      uVar10 = 0;
      do {
        if (last_ps->num <= uVar10) {
          return CURLM_OK;
        }
        iVar5 = last_ps->sockets[uVar10];
        uVar11 = 0;
        do {
          if (ps->num == uVar11) {
            pCVar7 = sh_getentry(local_50,iVar5);
            if (pCVar7 != (Curl_sh_entry *)0x0) {
              bVar9 = last_ps->actions[uVar10];
              uVar12 = pCVar7->users - 1;
              pCVar7->users = uVar12;
              if ((bVar9 & 2) != 0) {
                pCVar7->writers = pCVar7->writers - 1;
              }
              if ((bVar9 & 1) != 0) {
                pCVar7->readers = pCVar7->readers - 1;
              }
              if (uVar12 == 0) {
                if (pCVar4->socket_cb == (curl_socket_callback)0x0) {
                  sh_delentry(pCVar7,local_50,iVar5);
                }
                else {
                  pCVar4->field_0x279 = pCVar4->field_0x279 | 4;
                  iVar6 = (*pCVar4->socket_cb)
                                    (data_local,iVar5,4,pCVar4->socket_userp,pCVar7->socketp);
                  local_40 = CONCAT44(local_40._4_4_,iVar6);
                  pCVar4->field_0x279 = pCVar4->field_0x279 & 0xfb;
                  sh_delentry(pCVar7,local_50,iVar5);
                  if ((int)local_40 == -1) {
                    local_48->field_0x279 = local_48->field_0x279 | 0x10;
                    return CURLM_ABORTED_BY_CALLBACK;
                  }
                }
              }
              else {
                Curl_hash_delete(&pCVar7->transfers,&data_local,8);
              }
            }
            break;
          }
          pcVar1 = ps->sockets + uVar11;
          uVar11 = uVar11 + 1;
        } while (iVar5 != *pcVar1);
        uVar10 = uVar10 + 1;
      } while( true );
    }
    bVar9 = ps->actions[uVar10];
    iVar5 = ps->sockets[uVar10];
    local_40 = uVar10;
    pCVar7 = sh_getentry(local_50,iVar5);
    if (pCVar7 == (Curl_sh_entry *)0x0) {
      local_34 = iVar5;
      pCVar7 = sh_getentry(sh,iVar5);
      if (pCVar7 == (Curl_sh_entry *)0x0) {
        pCVar7 = (Curl_sh_entry *)(*Curl_ccalloc)(1,0x48);
        if (pCVar7 == (Curl_sh_entry *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        Curl_hash_init((Curl_hash *)pCVar7,0xd,trhash,trhash_compare,trhash_dtor);
        pvVar8 = Curl_hash_add(sh,&local_34,4,pCVar7);
        if (pvVar8 == (void *)0x0) {
          Curl_hash_destroy((Curl_hash *)pCVar7);
          (*Curl_cfree)(pCVar7);
          return CURLM_OUT_OF_MEMORY;
        }
      }
LAB_00142459:
      pvVar8 = Curl_hash_pick(&pCVar7->transfers,&data_local,8);
      bVar3 = true;
      if (pvVar8 == (void *)0x0) {
        pCVar7->users = pCVar7->users + 1;
        if ((bVar9 & 1) != 0) {
          pCVar7->readers = pCVar7->readers + 1;
        }
        if ((bVar9 & 2) != 0) {
          pCVar7->writers = pCVar7->writers + 1;
        }
        pvVar8 = Curl_hash_add(&pCVar7->transfers,&data_local,8,data_local);
        if (pvVar8 == (void *)0x0) {
          Curl_hash_destroy(&pCVar7->transfers);
          return CURLM_OUT_OF_MEMORY;
        }
      }
    }
    else {
      uVar10 = 0;
      do {
        uVar11 = uVar10;
        if (last_ps->num == uVar11) goto LAB_00142459;
        uVar10 = uVar11 + 1;
      } while (iVar5 != last_ps->sockets[uVar11]);
      bVar2 = last_ps->actions[uVar11];
      if (bVar2 == 0) goto LAB_00142459;
      if (bVar2 != bVar9) {
        if ((bVar2 & 1) != 0) {
          pCVar7->readers = pCVar7->readers - 1;
        }
        if ((bVar2 & 2) != 0) {
          pCVar7->writers = pCVar7->writers - 1;
        }
        if ((bVar9 & 1) != 0) {
          pCVar7->readers = pCVar7->readers + 1;
        }
        if ((bVar9 & 2) != 0) {
          pCVar7->writers = pCVar7->writers + 1;
        }
      }
      bVar3 = false;
    }
    pCVar4 = local_48;
    uVar12 = (uint)(pCVar7->readers != 0) + (uint)(pCVar7->writers != 0) * 2;
    if ((bVar3) || (pCVar7->action != uVar12)) {
      if (local_48->socket_cb != (curl_socket_callback)0x0) {
        local_48->field_0x279 = local_48->field_0x279 | 4;
        iVar5 = (*local_48->socket_cb)
                          (data_local,iVar5,uVar12,local_48->socket_userp,pCVar7->socketp);
        bVar9 = pCVar4->field_0x279 & 0xfb;
        pCVar4->field_0x279 = bVar9;
        if (iVar5 == -1) {
          pCVar4->field_0x279 = bVar9 | 0x10;
          return CURLM_ABORTED_BY_CALLBACK;
        }
      }
      pCVar7->action = uVar12;
    }
    uVar10 = local_40 + 1;
  } while( true );
}

Assistant:

CURLMcode Curl_multi_pollset_ev(struct Curl_multi *multi,
                                struct Curl_easy *data,
                                struct easy_pollset *ps,
                                struct easy_pollset *last_ps)
{
  unsigned int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int rc;

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; i < ps->num; i++) {
    unsigned char cur_action = ps->actions[i];
    unsigned char last_action = 0;
    int comboaction;

    s = ps->sockets[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* check if new for this transfer */
      unsigned int j;
      for(j = 0; j < last_ps->num; j++) {
        if(s == last_ps->sockets[j]) {
          last_action = last_ps->actions[j];
          break;
        }
      }
    }
    else {
      /* this is a socket we did not have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(last_action && (last_action != cur_action)) {
      /* Socket was used already, but different action now */
      if(last_action & CURL_POLL_IN) {
        DEBUGASSERT(entry->readers);
        entry->readers--;
      }
      if(last_action & CURL_POLL_OUT) {
        DEBUGASSERT(entry->writers);
        entry->writers--;
      }
      if(cur_action & CURL_POLL_IN) {
        entry->readers++;
      }
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!last_action &&
            !Curl_hash_pick(&entry->transfers, (char *)&data, /* hash key */
                            sizeof(struct Curl_easy *))) {
      DEBUGASSERT(entry->users < 100000); /* detect weird values */
      /* a new transfer using this socket */
      entry->users++;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data)) {
        Curl_hash_destroy(&entry->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }

    comboaction = (entry->writers ? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(last_action && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb) {
      set_in_callback(multi, TRUE);
      rc = multi->socket_cb(data, s, comboaction, multi->socket_userp,
                            entry->socketp);

      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }

    /* store the current action state */
    entry->action = (unsigned int)comboaction;
  }

  /* Check for last_poll.sockets that no longer appear in ps->sockets.
   * Need to remove the easy handle from the multi->sockhash->transfers and
   * remove multi->sockhash entry when this was the last transfer */
  for(i = 0; i < last_ps->num; i++) {
    unsigned int j;
    bool stillused = FALSE;
    s = last_ps->sockets[i];
    for(j = 0; j < ps->num; j++) {
      if(s == ps->sockets[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = last_ps->actions[i];
      /* this socket has been removed. Decrease user count */
      DEBUGASSERT(entry->users);
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        bool dead = FALSE;
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
          if(rc == -1)
            dead = TRUE;
        }
        sh_delentry(entry, &multi->sockhash, s);
        if(dead) {
          multi->dead = TRUE;
          return CURLM_ABORTED_BY_CALLBACK;
        }
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over num */

  return CURLM_OK;
}